

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O1

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,compute_filtration_t *f,
          int min_dimension,int max_dimension)

{
  initializer_list<directed_flag_complex_in_memory_computer::compute_filtration_t> __l;
  vector<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
  fs;
  allocator_type local_71;
  vector<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
  local_70;
  compute_filtration_t local_58;
  
  local_58.boundary_filtration = f->boundary_filtration;
  local_58.current_index = f->current_index;
  local_58._4_4_ = *(undefined4 *)&f->field_0x4;
  local_58.filtration_algorithm = f->filtration_algorithm;
  local_58.graph = f->graph;
  local_58.complex = f->complex;
  std::vector<float,_std::allocator<float>_>::vector(&local_58.next_filtration,&f->next_filtration);
  __l._M_len = 1;
  __l._M_array = &local_58;
  std::
  vector<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
  ::vector(&local_70,__l,&local_71);
  if (local_58.next_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.next_filtration.super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.next_filtration.super__Vector_base<float,_std::allocator<float>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.next_filtration.super__Vector_base<float,_std::allocator<float>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
            (this,&local_70,min_dimension,max_dimension);
  std::
  vector<directed_flag_complex_in_memory_computer::compute_filtration_t,_std::allocator<directed_flag_complex_in_memory_computer::compute_filtration_t>_>
  ::~vector(&local_70);
  return;
}

Assistant:

void for_each_cell(Func& f, int min_dimension, int max_dimension = -1) {
		std::vector<Func> fs{{f}};
		for_each_cell(fs, min_dimension, max_dimension);
	}